

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cost_enc.c
# Opt level: O0

int VP8GetCostUV(VP8EncIterator *it,VP8ModeScore *rd)

{
  int iVar1;
  VP8Encoder *enc_00;
  int iVar2;
  long in_RSI;
  VP8EncIterator *in_RDI;
  int ctx;
  int R;
  int y;
  int x;
  int ch;
  VP8Encoder *enc;
  VP8Residual res;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  VP8Residual local_40;
  long local_10;
  VP8EncIterator *local_8;
  
  enc_00 = in_RDI->enc_;
  local_58 = 0;
  local_10 = in_RSI;
  local_8 = in_RDI;
  VP8IteratorNzToBytes(in_RDI);
  VP8InitResidual(0,2,enc_00,&local_40);
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 2) {
    for (local_54 = 0; local_54 < 2; local_54 = local_54 + 1) {
      for (local_50 = 0; local_50 < 2; local_50 = local_50 + 1) {
        iVar2 = local_8->top_nz_[local_4c + 4 + local_50];
        iVar1 = local_8->left_nz_[local_4c + 4 + local_54];
        (*VP8SetResidualCoeffs)
                  ((int16_t *)
                   (local_10 + 0x248 + (long)(local_4c * 2 + local_50 + local_54 * 2) * 0x20),
                   &local_40);
        iVar2 = (*VP8GetResidualCost)(iVar2 + iVar1,&local_40);
        local_58 = iVar2 + local_58;
        local_8->left_nz_[local_4c + 4 + local_54] = (uint)(-1 < local_40.last);
        local_8->top_nz_[local_4c + 4 + local_50] = (uint)(-1 < local_40.last);
      }
    }
  }
  return local_58;
}

Assistant:

int VP8GetCostUV(VP8EncIterator* const it, const VP8ModeScore* const rd) {
  VP8Residual res;
  VP8Encoder* const enc = it->enc_;
  int ch, x, y;
  int R = 0;

  VP8IteratorNzToBytes(it);  // re-import the non-zero context

  VP8InitResidual(0, 2, enc, &res);
  for (ch = 0; ch <= 2; ch += 2) {
    for (y = 0; y < 2; ++y) {
      for (x = 0; x < 2; ++x) {
        const int ctx = it->top_nz_[4 + ch + x] + it->left_nz_[4 + ch + y];
        VP8SetResidualCoeffs(rd->uv_levels[ch * 2 + x + y * 2], &res);
        R += VP8GetResidualCost(ctx, &res);
        it->top_nz_[4 + ch + x] = it->left_nz_[4 + ch + y] = (res.last >= 0);
      }
    }
  }
  return R;
}